

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O1

exr_result_t
exr_decoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_decode_pipeline_t *decode)

{
  _internal_exr_part *part;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  exr_result_t eVar14;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar15;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar14 = (**(code **)(ctxt + 0x48))
                         (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                          *(code **)(ctxt + 0x48));
      return eVar14;
    }
    if (cinfo != (exr_chunk_info_t *)0x0 && decode != (exr_decode_pipeline_t *)0x0) {
      part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      memset(decode,0,0x1e0);
      eVar14 = internal_coding_fill_channel_info
                         (&decode->channels,&decode->channel_count,decode->_quick_chan_store,cinfo,
                          (_internal_exr_context *)ctxt,part);
      if (eVar14 != 0) {
        return eVar14;
      }
      decode->part_index = part_index;
      decode->context = ctxt;
      iVar6 = cinfo->start_x;
      iVar7 = cinfo->start_y;
      iVar8 = cinfo->height;
      iVar9 = cinfo->width;
      uVar10 = cinfo->level_x;
      uVar11 = cinfo->level_y;
      uVar12 = cinfo->type;
      uVar13 = cinfo->compression;
      uVar1 = cinfo->data_offset;
      uVar2 = cinfo->packed_size;
      uVar3 = cinfo->unpacked_size;
      uVar4 = cinfo->sample_count_data_offset;
      uVar5 = cinfo->sample_count_table_size;
      (decode->chunk).idx = cinfo->idx;
      (decode->chunk).start_x = iVar6;
      (decode->chunk).start_y = iVar7;
      (decode->chunk).height = iVar8;
      (decode->chunk).width = iVar9;
      (decode->chunk).level_x = uVar10;
      (decode->chunk).level_y = uVar11;
      (decode->chunk).type = uVar12;
      (decode->chunk).compression = uVar13;
      (decode->chunk).data_offset = uVar1;
      (decode->chunk).packed_size = uVar2;
      (decode->chunk).unpacked_size = uVar3;
      (decode->chunk).sample_count_data_offset = uVar4;
      (decode->chunk).sample_count_table_size = uVar5;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar15 = 3;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar15 = 7;
  }
  eVar14 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar15);
  return eVar14;
}

Assistant:

exr_result_t
exr_decoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t          rv;
    exr_decode_pipeline_t nil = {0};

    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !decode)
        return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    *decode = nil;

    rv = internal_coding_fill_channel_info (
        &(decode->channels),
        &(decode->channel_count),
        decode->_quick_chan_store,
        cinfo,
        pctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        decode->part_index = part_index;
        decode->context    = ctxt;
        decode->chunk      = *cinfo;
    }
    return rv;
}